

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O2

void fsg_model_trans_add(fsg_model_t *fsg,int32 from,int32 to,int32 logp,int32 wid)

{
  long lVar1;
  hash_table_t *phVar2;
  glist_t pgVar3;
  gnode_s *pgVar4;
  int32 *ptr;
  
  if (fsg->trans[from].trans == (hash_table_t *)0x0) {
    phVar2 = hash_table_new(5,0);
    fsg->trans[from].trans = phVar2;
  }
  pgVar3 = fsg_model_trans(fsg,from,to);
  pgVar4 = pgVar3;
  while( true ) {
    if (pgVar4 == (glist_t)0x0) {
      ptr = (int32 *)__listelem_malloc__(fsg->link_alloc,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                                         ,0x72);
      *ptr = from;
      ptr[1] = to;
      ptr[2] = logp;
      ptr[3] = wid;
      pgVar3 = glist_add_ptr(pgVar3,ptr);
      hash_table_replace_bkey(fsg->trans[from].trans,(char *)(ptr + 1),4,pgVar3);
      return;
    }
    lVar1 = (pgVar4->data).i;
    if (*(int *)(lVar1 + 0xc) == wid) break;
    pgVar4 = pgVar4->next;
  }
  if (*(int *)(lVar1 + 8) < logp) {
    *(int32 *)(lVar1 + 8) = logp;
  }
  return;
}

Assistant:

void
fsg_model_trans_add(fsg_model_t * fsg,
                    int32 from, int32 to, int32 logp, int32 wid)
{
    fsg_link_t *link;
    glist_t gl;
    gnode_t *gn;

    if (fsg->trans[from].trans == NULL)
        fsg->trans[from].trans = hash_table_new(5, HASH_CASE_YES);

    /* Check for duplicate link (i.e., link already exists with label=wid) */
    for (gn = gl = fsg_model_trans(fsg, from, to); gn; gn = gnode_next(gn)) {
        link = (fsg_link_t *) gnode_ptr(gn);
        if (link->wid == wid) {
            if (link->logs2prob < logp)
                link->logs2prob = logp;
            return;
        }
    }

    /* Create transition object */
    link = listelem_malloc(fsg->link_alloc);
    link->from_state = from;
    link->to_state = to;
    link->logs2prob = logp;
    link->wid = wid;

    /* Add it to the list of transitions and update the hash table */
    gl = glist_add_ptr(gl, (void *) link);
    hash_table_replace_bkey(fsg->trans[from].trans,
                            (char const *) &link->to_state,
                            sizeof(link->to_state), gl);
}